

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O0

void __thiscall
flow::TargetCodeGenerator::visit(TargetCodeGenerator *this,HandlerCallInstr *handlerCallInstr)

{
  int iVar1;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> *pvVar2;
  size_type sVar3;
  Value *value;
  IRBuiltinHandler *handler;
  size_t sVar4;
  int local_20;
  int i;
  int argc;
  HandlerCallInstr *handlerCallInstr_local;
  TargetCodeGenerator *this_local;
  
  pvVar2 = Instr::operands(&handlerCallInstr->super_Instr);
  sVar3 = std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::size(pvVar2);
  iVar1 = (int)sVar3 + -1;
  for (local_20 = 1; local_20 <= iVar1; local_20 = local_20 + 1) {
    value = Instr::operand(&handlerCallInstr->super_Instr,(long)local_20);
    emitLoad(this,value);
  }
  handler = HandlerCallInstr::callee(handlerCallInstr);
  sVar4 = ConstantPool::makeNativeHandler(&this->cp_,handler);
  pvVar2 = Instr::operands(&handlerCallInstr->super_Instr);
  sVar3 = std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::size(pvVar2);
  emitInstr(this,HANDLER,(Operand)sVar4,(short)sVar3 - 1);
  if (iVar1 != 0) {
    pop(this,(long)iVar1);
  }
  return;
}

Assistant:

void TargetCodeGenerator::visit(HandlerCallInstr& handlerCallInstr) {
  int argc = handlerCallInstr.operands().size() - 1;
  for (int i = 1; i <= argc; ++i)
    emitLoad(handlerCallInstr.operand(i));

  emitInstr(Opcode::HANDLER,
      cp_.makeNativeHandler(handlerCallInstr.callee()),
      handlerCallInstr.operands().size() - 1);

  if (argc)
    pop(argc);
}